

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_01;
  int iVar2;
  DBErrors DVar3;
  undefined8 uVar4;
  pointer pbVar5;
  uint uVar6;
  _Any_data *p_Var7;
  DBErrors DVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  DataStream ssKey;
  string error;
  string type;
  undefined8 in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffed0;
  DataStream local_128;
  DataStream local_108;
  CWallet *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Any_data *local_78 [2];
  _Any_data local_68;
  _Any_data *local_58 [2];
  _Any_data local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_read_pos = 0;
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.m_read_pos = 0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (prefix->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + prefix->m_read_pos;
  (*batch->_vptr_DatabaseBatch[10])
            (&stack0xfffffffffffffed0,batch,pbVar5,
             (long)(prefix->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar5);
  if (in_stack_fffffffffffffed0 == (long *)0x0) {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_58[0] = &local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + key->_M_string_length);
    parameters_00._M_string_length = (size_type)pwallet;
    parameters_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    parameters_00.field_2._M_allocated_capacity = (size_type)key;
    parameters_00.field_2._8_8_ = in_stack_fffffffffffffed0;
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (pwallet,"Error getting database cursor for \'%s\' records\n",parameters_00);
    uVar6 = 0;
    uVar9 = 9;
    p_Var7 = local_58[0];
    if (local_58[0] == &local_48) goto LAB_0056238a;
  }
  else {
    DVar8 = LOAD_OK;
    uVar6 = 0;
    while (iVar2 = (**(code **)(*in_stack_fffffffffffffed0 + 0x10))
                             (in_stack_fffffffffffffed0,&local_108,&local_128), iVar2 != 0) {
      if (iVar2 == 2) {
        uVar9 = (ulong)DVar8;
        goto LAB_0056238a;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      Unserialize<DataStream,char>(&local_108,&local_98);
      if ((local_98._M_string_length != key->_M_string_length) ||
         ((local_98._M_string_length != 0 &&
          (iVar2 = bcmp(local_98._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_98._M_string_length)
          , iVar2 != 0)))) {
        __assert_fail("type == key",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
                      ,0x209,
                      "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                     );
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_e0 = pwallet;
      if ((load_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar4 = std::__throw_bad_function_call();
          if (local_78[0] != (_Any_data *)load_func) {
            operator_delete(local_78[0],(ulong)(local_68._M_unused._M_member_pointer + 1));
          }
          if (in_stack_fffffffffffffed0 != (long *)0x0) {
            (**(code **)(*in_stack_fffffffffffffed0 + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_128);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_108);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar4);
          }
        }
        goto LAB_00562551;
      }
      DVar3 = (*load_func->_M_invoker)
                        ((_Any_data *)load_func,&local_e0,&local_108,&local_128,&local_b8);
      if (DVar3 != LOAD_OK) {
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
        parameters._M_string_length = (size_type)pwallet;
        parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
        parameters.field_2._M_allocated_capacity = (size_type)key;
        parameters.field_2._8_8_ = in_stack_fffffffffffffed0;
        CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,"%s\n",parameters);
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
      }
      if ((int)DVar8 <= (int)DVar3) {
        DVar8 = DVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      uVar6 = uVar6 + 1;
    }
    pcVar1 = (key->_M_dataplus)._M_p;
    local_78[0] = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar1,pcVar1 + key->_M_string_length);
    parameters_01._M_string_length = (size_type)pwallet;
    parameters_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    parameters_01.field_2._M_allocated_capacity = (size_type)key;
    parameters_01.field_2._8_8_ = in_stack_fffffffffffffed0;
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (pwallet,"Error reading next \'%s\' record for wallet database\n",parameters_01);
    uVar9 = 9;
    local_48._M_unused._0_8_ = local_68._M_unused._0_8_;
    p_Var7 = local_78[0];
    if (local_78[0] == &local_68) goto LAB_0056238a;
  }
  uVar9 = 9;
  operator_delete(p_Var7,(ulong)(local_48._M_unused._M_member_pointer + 1));
LAB_0056238a:
  if (in_stack_fffffffffffffed0 != (long *)0x0) {
    (**(code **)(*in_stack_fffffffffffffed0 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_128);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (LoadResult)((ulong)uVar6 << 0x20 | uVar9);
  }
LAB_00562551:
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}